

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmainfo.c
# Opt level: O2

char * vma_info(void *ptr)

{
  char *pcVar1;
  int iVar2;
  char *__s;
  FILE *pFVar3;
  __ssize_t _Var4;
  size_t sVar5;
  char *pcVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  void *__ptr;
  char *line;
  void *local_60;
  FILE *local_58;
  ulong local_50;
  size_t line_n;
  unsigned_long b;
  unsigned_long a;
  
  line = (char *)0x0;
  line_n = 0;
  __s = (char *)malloc(0x800);
  if (__s != (char *)0x0) {
    *__s = '\0';
    pFVar3 = fopen("/proc/self/smaps","r");
    if (pFVar3 != (FILE *)0x0) {
      __ptr = (void *)0x0;
      uVar8 = 0;
      local_60 = ptr;
      local_58 = pFVar3;
      while (_Var4 = getline(&line,&line_n,pFVar3), _Var4 != -1) {
        iVar2 = __isoc99_sscanf(line,"%lx-%lx",&a,&b);
        if (((iVar2 == 2) && (a <= local_60)) && (local_60 < b)) {
          sVar5 = strlen(__s);
          builtin_strncpy(__s + sVar5,"    ",5);
          strcat(__s,line);
          while (_Var4 = getline(&line,&line_n,pFVar3), pcVar1 = line, _Var4 != -1) {
            if ((0x19 < (byte)(*line + 0xbfU)) ||
               (pcVar6 = strchr(line,0x3a), pcVar6 == (char *)0x0)) {
              free(pcVar1);
              goto LAB_00220698;
            }
            uVar9 = (ulong)((int)uVar8 + 1);
            pvVar7 = realloc(__ptr,uVar9 * 8);
            pcVar1 = line;
            if (pvVar7 == (void *)0x0) goto LAB_00220698;
            line = (char *)0x0;
            line_n = 0;
            *(char **)((long)pvVar7 + uVar8 * 8) = pcVar1;
            uVar8 = uVar9;
            __ptr = pvVar7;
          }
        }
      }
      goto LAB_00220698;
    }
  }
  local_58 = (FILE *)0x0;
  __ptr = (void *)0x0;
  uVar8 = 0;
LAB_00220698:
  uVar9 = uVar8 >> 1;
  local_60 = (void *)((long)__ptr + uVar9 * 8);
  local_50 = uVar8;
  for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    pcVar1 = *(char **)((long)__ptr + uVar10 * 8);
    sVar5 = strlen(pcVar1);
    pcVar1[sVar5 - 1] = '\0';
    sVar5 = strlen(__s);
    builtin_strncpy(__s + sVar5,"    ",5);
    strcat(__s,*(char **)((long)__ptr + uVar10 * 8));
    sVar5 = strlen(__s);
    builtin_strncpy(__s + sVar5,"  |  ",6);
    strcat(__s,*(char **)((long)local_60 + uVar10 * 8));
  }
  if ((uint)((int)uVar9 + (int)uVar10) < (uint)local_50) {
    sVar5 = strlen(__s);
    builtin_strncpy(__s + sVar5,"    ",5);
    strcat(__s,*(char **)((long)local_60 + uVar10 * 8));
  }
  pFVar3 = local_58;
  uVar9 = local_50 & 0xffffffff;
  for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    free(*(void **)((long)__ptr + uVar8 * 8));
  }
  free(__ptr);
  if (pFVar3 != (FILE *)0x0) {
    fclose(pFVar3);
  }
  return __s;
}

Assistant:

char *
vma_info(void *ptr)
{
	FILE *fp = NULL;
	char *buf = NULL;
	char *line = NULL;
	char **pairs = NULL, **tmp = NULL;
	unsigned pairs_cnt = 0;
	size_t line_n = 0;
	buf = malloc(2048);
	if (!buf)
		goto done;
	buf[0] = 0;
	fp = fopen("/proc/self/smaps", "r");
	if (!fp)
		goto done;
	while (getline(&line, &line_n, fp) != -1) {
		unsigned long a, b;
		if (sscanf(line, "%lx-%lx", &a, &b) != 2)
			continue;
		if (a <= (unsigned long)ptr && (unsigned long)ptr < b) {
			/* OK, found it! */
			strcat(buf, "    ");
			strcat(buf, line);
			while (getline(&line, &line_n, fp) != -1) {
				if (line[0] >= 'A' && line[0] <= 'Z'
						&& strchr(line, ':') != NULL) {
					tmp = realloc(pairs, (pairs_cnt+1) * sizeof(char *));
					if (!tmp)
						goto done;
					pairs = tmp;
					pairs[pairs_cnt++] = line;
					line = NULL;
					line_n = 0;
				} else {
					free(line);
					goto done;
				}
			}
		}
	}
done:
	add_smaps(buf, pairs, pairs_cnt);
	free_pairs(pairs, pairs_cnt);
	if (fp)
		fclose(fp);
	return buf;
}